

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protodec.c
# Opt level: O2

void protodec_decode(char *in,int count,demod_state_t *d)

{
  char cVar1;
  int iVar2;
  int length_bits;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = 0;
  uVar4 = (ulong)(uint)count;
  if (count < 1) {
    uVar4 = uVar3;
  }
  do {
    if (uVar4 == uVar3) {
      return;
    }
    switch(d->state) {
    case 1:
      iVar2 = 0;
      if (in[uVar3] != d->last) {
        iVar2 = d->antallpreamble + 1;
      }
      d->antallpreamble = iVar2;
      cVar1 = in[uVar3];
      d->last = cVar1;
      if (cVar1 == '\0' && 0xe < iVar2) {
        d->state = 2;
        d->nskurr = 0;
        d->antallpreamble = 0;
      }
      d->nskurr = d->nskurr + 1;
      break;
    case 2:
      if ((in[uVar3] == d->last) || (d->nstartsign != 0)) {
        iVar2 = d->nstartsign;
        if (in[uVar3] == '\x01') {
          if (iVar2 == 5) {
            d->npreamble = 0;
            d->nstartsign = 6;
            d->antallpreamble = 0;
            d->state = 3;
          }
          else if (iVar2 == 0) {
            d->nstartsign = 3;
            d->last = in[uVar3];
          }
          else {
            d->nstartsign = iVar2 + 1;
          }
        }
        else if (iVar2 == 0) {
          d->nstartsign = 1;
        }
        else {
          d->state = 1;
          d->antallpreamble = 0;
          d->bitstuff = 0;
          d->last = '\0';
          d->bufferpos = 0;
          d->nskurr = 0;
          d->npreamble = 0;
          d->nstartsign = 0;
          d->ndata = 0;
          d->nstopsign = 0;
          d->antallenner = 0;
        }
      }
      else {
        d->antallpreamble = d->antallpreamble + 1;
      }
      d->npreamble = d->npreamble + 1;
      break;
    case 3:
      iVar2 = d->nstartsign;
      if (iVar2 < 7) {
        if (in[uVar3] == '\0') goto LAB_0010302d;
      }
      else if (in[uVar3] == '\0') {
        d->state = 4;
        d->nstartsign = 0;
        d->antallenner = 0;
        memset(d->buffer,0,0x1c2);
        d->bufferpos = 0;
        iVar2 = d->nstartsign;
      }
      else {
LAB_0010302d:
        d->state = 1;
        d->antallpreamble = 0;
        d->bitstuff = 0;
        d->last = '\0';
        d->bufferpos = 0;
        d->nskurr = 0;
        d->npreamble = 0;
        d->nstartsign = 0;
        d->ndata = 0;
        d->nstopsign = 0;
        d->antallenner = 0;
        iVar2 = 0;
      }
      d->nstartsign = iVar2 + 1;
      break;
    case 4:
      if (d->bitstuff == 0) {
        if ((in[uVar3] == '\x01') && (d->last == '\x01')) {
          iVar2 = d->antallenner + 1;
          d->antallenner = iVar2;
          if (iVar2 == 4) {
            d->bitstuff = 1;
            goto LAB_0010309c;
          }
        }
        else {
LAB_0010309c:
          d->antallenner = 0;
        }
        d->buffer[d->bufferpos] = in[uVar3];
        iVar2 = d->bufferpos;
        d->bufferpos = iVar2 + 1;
        d->ndata = d->ndata + 1;
        if (0x1bf < iVar2) goto LAB_001030de;
      }
      else {
        if (in[uVar3] == '\x01') {
          d->state = 5;
          d->ndata = 0;
        }
        else {
          d->ndata = d->ndata + 1;
          d->last = in[uVar3];
        }
        d->bitstuff = 0;
      }
      break;
    case 5:
      if (d->bufferpos < 0x17 || in[uVar3] != '\0') {
        d->lostframes2 = d->lostframes2 + 1;
      }
      else {
        length_bits = d->bufferpos + -0x16;
        iVar2 = protodec_calculate_crc(length_bits,d);
        if (iVar2 == 0) {
          d->lostframes = d->lostframes + 1;
        }
        else {
          d->receivedframes = d->receivedframes + 1;
          protodec_getdata(length_bits,d);
        }
      }
LAB_001030de:
      d->state = 1;
      d->antallpreamble = 0;
      d->bitstuff = 0;
      d->last = '\0';
      d->bufferpos = 0;
      d->nskurr = 0;
      d->npreamble = 0;
      d->nstartsign = 0;
      d->ndata = 0;
      d->nstopsign = 0;
      d->antallenner = 0;
    }
    d->last = in[uVar3];
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

void protodec_decode(char *in, int count, struct demod_state_t *d)
{
	int i = 0;
	int bufferlength, correct;
	
	while (i < count) {
		switch (d->state) {
		case ST_DATA:
			if (d->bitstuff) {
				if (in[i] == 1) {
					d->state = ST_STOPSIGN;
					d->ndata = 0;
					d->bitstuff = 0;
				} else {
					d->ndata++;
					d->last = in[i];
					d->bitstuff = 0;
				}
			} else {
				if (in[i] == d->last && in[i] == 1) {
					d->antallenner++;
					if (d->antallenner == 4) {
						d->bitstuff = 1;
						d->antallenner = 0;
					}

				} else
					d->antallenner = 0;

				d->buffer[d->bufferpos] = in[i];
				d->bufferpos++;
				d->ndata++;
				
				if (d->bufferpos >= 449) {
					protodec_reset(d);
				}
			}
			break;

        case ST_SKURR:
			if (in[i] != d->last)
				d->antallpreamble++;
			else
				d->antallpreamble = 0;
			d->last = in[i];
			if (d->antallpreamble > 14 && in[i] == 0) {
				d->state = ST_PREAMBLE;
				d->nskurr = 0;
				d->antallpreamble = 0;
			}
			d->nskurr++;
			break;

        case ST_PREAMBLE:
			if (in[i] != d->last && d->nstartsign == 0) {
				d->antallpreamble++;
			} else {
                if (in[i] == 1)	{
                    if (d->nstartsign == 0) {
						d->nstartsign = 3;
						d->last = in[i];
                    } else if (d->nstartsign == 5) {
						d->nstartsign++;
						d->npreamble = 0;
						d->antallpreamble = 0;
						d->state = ST_STARTSIGN;
					} else {
						d->nstartsign++;
					}

                } else {
					if (d->nstartsign == 0) {
						d->nstartsign = 1;
					} else {
						protodec_reset(d);
					}
				}
			}
			d->npreamble++;
			break;

		case ST_STARTSIGN:
			if (d->nstartsign >= 7) {
				if (in[i] == 0) {
					d->state = ST_DATA;
					d->nstartsign = 0;
					d->antallenner = 0;
					memset(d->buffer, 0, DEMOD_BUFFER_LEN);
					d->bufferpos = 0;
				} else {
					protodec_reset(d);
				}

			} else if (in[i] == 0) {
				protodec_reset(d);
			}
			d->nstartsign++;
			break;

		case ST_STOPSIGN:
			bufferlength = d->bufferpos - 6 - 16;
			if (in[i] == 0 && bufferlength > 0) {
				correct = protodec_calculate_crc(bufferlength, d);
				if (correct) {
					d->receivedframes++;
					protodec_getdata(bufferlength, d);
				} else {
					d->lostframes++;
				}
			} else {
				d->lostframes2++;
			}
			protodec_reset(d);
			break;


		}
		d->last = in[i];
		i++;
	}
}